

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

TResourceType __thiscall
glslang::TDefaultHlslIoResolver::getResourceType(TDefaultHlslIoResolver *this,TType *type)

{
  bool bVar1;
  int iVar2;
  TResourceType TVar3;
  undefined4 extraout_var;
  
  bVar1 = TDefaultIoResolverBase::isUavType(type);
  if (bVar1) {
    TVar3 = EResUav;
  }
  else {
    bVar1 = TDefaultIoResolverBase::isSrvType(type);
    if (bVar1) {
      TVar3 = EResTexture;
    }
    else {
      bVar1 = TDefaultIoResolverBase::isSamplerType(type);
      TVar3 = EResSampler;
      if (!bVar1) {
        iVar2 = (*type->_vptr_TType[0xb])(type);
        TVar3 = (uint)((*(uint *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) != 5) * 3 + EResUbo;
      }
    }
  }
  return TVar3;
}

Assistant:

TResourceType getResourceType(const glslang::TType& type) override {
        if (isUavType(type)) {
            return EResUav;
        }
        if (isSrvType(type)) {
            return EResTexture;
        }
        if (isSamplerType(type)) {
            return EResSampler;
        }
        if (isUboType(type)) {
            return EResUbo;
        }
        return EResCount;
    }